

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86formatter.cpp
# Opt level: O1

Error asmjit::v1_14::x86::FormatterInternal::formatOperand
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  char c;
  uint uVar1;
  Error EVar2;
  Error EVar3;
  Error EVar4;
  ulong uVar5;
  uint32_t uVar6;
  char *pcVar7;
  FormatFlags formatFlags_00;
  char c_00;
  StringFormatFlags flags;
  uint uVar8;
  ulong i;
  bool bVar9;
  
  uVar1 = (op->_signature)._bits;
  switch(uVar1 & 7) {
  case 1:
    EVar2 = formatRegister(sb,formatFlags,emitter,kUnknown,(byte)uVar1 >> 3,op->_baseId);
    return EVar2;
  case 2:
    break;
  default:
    EVar2 = String::_opString(sb,kAppend,"<None>",0xffffffffffffffff);
    return EVar2;
  case 4:
    uVar5 = *(ulong *)op->_data;
    if (((formatFlags & kHexImms) == kNone) || (uVar5 < 10)) {
      uVar6 = 10;
      flags = kSigned;
    }
    else {
      EVar2 = String::_opString(sb,kAppend,"0x",2);
      if (EVar2 != 0) {
        return EVar2;
      }
      uVar6 = 0x10;
      flags = kNone;
    }
    EVar2 = String::_opNumber(sb,kAppend,uVar5,uVar6,0,flags);
    return EVar2;
  case 5:
    EVar2 = Formatter::formatLabel(sb,formatFlags,emitter,op->_baseId);
    return EVar2;
  }
  uVar1 = uVar1 >> 0x18;
  switch(uVar1) {
  case 1:
    pcVar7 = "byte ptr ";
    break;
  case 2:
    pcVar7 = "word ptr ";
    break;
  case 3:
  case 5:
  case 7:
  case 9:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
switchD_0014441c_caseD_3:
    pcVar7 = "";
    break;
  case 4:
    pcVar7 = "dword ptr ";
    break;
  case 6:
    pcVar7 = "fword ptr ";
    break;
  case 8:
    pcVar7 = "qword ptr ";
    break;
  case 10:
    pcVar7 = "tbyte ptr ";
    break;
  case 0x10:
    pcVar7 = "xmmword ptr ";
    break;
  default:
    if (uVar1 == 0x20) {
      pcVar7 = "ymmword ptr ";
    }
    else {
      if (uVar1 != 0x40) goto switchD_0014441c_caseD_3;
      pcVar7 = "zmmword ptr ";
    }
  }
  EVar2 = String::_opString(sb,kAppend,pcVar7,0xffffffffffffffff);
  if (EVar2 != 0) {
    return EVar2;
  }
  if ((((op->_signature)._bits >> 0x12 & 7) - 1 < 6) &&
     (EVar2 = String::_opFormat(sb,kAppend,"%s:"), EVar2 != 0)) {
    return EVar2;
  }
  EVar2 = String::_opChar(sb,kAppend,'[');
  if (EVar2 != 0) {
    return EVar2;
  }
  uVar1 = (op->_signature)._bits >> 0xe & 3;
  if (uVar1 == 2) {
    pcVar7 = "rel ";
LAB_0014458c:
    EVar2 = String::_opString(sb,kAppend,pcVar7,0xffffffffffffffff);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  else if (uVar1 == 1) {
    pcVar7 = "abs ";
    goto LAB_0014458c;
  }
  uVar1 = (op->_signature)._bits;
  uVar8 = uVar1 & 0xf8;
  EVar2 = 0;
  if (uVar8 == 0) {
    c_00 = '\0';
  }
  else if (uVar8 == 8) {
    EVar3 = Formatter::formatLabel(sb,formatFlags,emitter,op->_baseId);
    if (EVar3 != 0) {
      return EVar3;
    }
    c_00 = '+';
  }
  else {
    formatFlags_00 = formatFlags;
    if ((uVar1 >> 0xd & 1) == 0) {
LAB_00144609:
      EVar4 = formatRegister(sb,formatFlags_00,emitter,kUnknown,(byte)(op->_signature)._bits >> 3,
                             op->_baseId);
      bVar9 = EVar4 == 0;
      EVar3 = EVar2;
      if (!bVar9) {
        EVar3 = EVar4;
      }
    }
    else {
      EVar3 = String::_opString(sb,kAppend,"&",0xffffffffffffffff);
      if (EVar3 == 0) {
        formatFlags_00 = formatFlags & ~kRegCasts;
        goto LAB_00144609;
      }
      bVar9 = false;
    }
    c_00 = '+';
    EVar2 = EVar3;
    if (!bVar9) {
      return EVar3;
    }
  }
  if (((op->_signature)._bits & 0x1f00) != 0) {
    if ((uVar8 != 0) && (EVar3 = String::_opChar(sb,kAppend,c_00), EVar3 != 0)) {
      return EVar3;
    }
    EVar3 = formatRegister(sb,formatFlags,emitter,kUnknown,
                           (RegType)((op->_signature)._bits >> 8) & kMaxValue,op->_data[0]);
    if (EVar3 != 0) {
      return EVar3;
    }
    uVar1 = (op->_signature)._bits;
    c_00 = '+';
    if ((uVar1 & 0x30000) != 0) {
      EVar3 = String::_opFormat(sb,kAppend,"*%u",(ulong)(uint)(1 << ((byte)(uVar1 >> 0x10) & 3)));
      c_00 = '+';
      if (EVar3 != 0) {
        return EVar3;
      }
    }
  }
  uVar1 = (op->_signature)._bits;
  uVar5 = CONCAT44(op->_baseId,op->_data[1]);
  if ((uVar1 & 0xf8) != 0) {
    uVar5 = (long)(int)op->_data[1];
  }
  if (((uVar1 & 0x1ff8) != 0) && (uVar5 == 0)) goto LAB_00144782;
  i = -uVar5;
  if (0 < (long)uVar5) {
    i = uVar5;
  }
  c = '-';
  if (-1 < (long)uVar5) {
    c = c_00;
  }
  if ((c != '\0') && (EVar3 = String::_opChar(sb,kAppend,c), EVar3 != 0)) {
    return EVar3;
  }
  uVar6 = 10;
  if (((formatFlags & kHexOffsets) == kNone) || (i < 10)) {
LAB_0014475d:
    EVar3 = String::_opNumber(sb,kAppend,i,uVar6,0,kNone);
    bVar9 = EVar3 == 0;
    if (!bVar9) {
      EVar2 = EVar3;
    }
  }
  else {
    EVar3 = String::_opString(sb,kAppend,"0x",2);
    if (EVar3 == 0) {
      uVar6 = 0x10;
      goto LAB_0014475d;
    }
    bVar9 = false;
    EVar2 = EVar3;
  }
  if (!bVar9) {
    return EVar2;
  }
LAB_00144782:
  EVar2 = String::_opChar(sb,kAppend,']');
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg())
    return formatRegister(sb, formatFlags, emitter, arch, op.as<BaseReg>().type(), op.as<BaseReg>().id());

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append(x86GetAddressSizeString(m.size())));

    // Segment override prefix.
    uint32_t seg = m.segmentId();
    if (seg != SReg::kIdNone && seg < SReg::kIdCount)
      ASMJIT_PROPAGATE(sb.appendFormat("%s:", x86RegFormatInfo.nameStrings + 224 + size_t(seg) * 4));

    ASMJIT_PROPAGATE(sb.append('['));
    switch (m.addrType()) {
      case Mem::AddrType::kDefault:
        break;
      case Mem::AddrType::kAbs:
        ASMJIT_PROPAGATE(sb.append("abs "));
        break;
      case Mem::AddrType::kRel:
        ASMJIT_PROPAGATE(sb.append("rel "));
        break;
    }

    char opSign = '\0';
    if (m.hasBase()) {
      opSign = '+';
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, formatFlags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = formatFlags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append("&"));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }

    if (m.hasIndex()) {
      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      opSign = '+';
      ASMJIT_PROPAGATE(formatRegister(sb, formatFlags, emitter, arch, m.indexType(), m.indexId()));
      if (m.hasShift())
        ASMJIT_PROPAGATE(sb.appendFormat("*%u", 1 << m.shift()));
    }

    uint64_t off = uint64_t(m.offset());
    if (off || !m.hasBaseOrIndex()) {
      if (int64_t(off) < 0) {
        opSign = '-';
        off = ~off + 1;
      }

      if (opSign)
        ASMJIT_PROPAGATE(sb.append(opSign));

      uint32_t base = 10;
      if (Support::test(formatFlags, FormatFlags::kHexOffsets) && off > 9) {
        ASMJIT_PROPAGATE(sb.append("0x", 2));
        base = 16;
      }

      ASMJIT_PROPAGATE(sb.appendUInt(off, base));
    }

    return sb.append(']');
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();

    if (Support::test(formatFlags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x", 2));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, formatFlags, emitter, op.id());
  }

  return sb.append("<None>");
}